

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O3

void CVmObjBigNum::compute_diff_into(char *result,char *ext1,char *ext2)

{
  byte bVar1;
  
  if (((ext2[4] ^ ext1[4]) & 1U) == 0) {
    compute_abs_diff_into(result,ext1,ext2);
    if ((ext1[4] & 1U) == 0) {
      return;
    }
    if ((result[4] & 8U) != 0) {
      return;
    }
    bVar1 = result[4] ^ 1;
  }
  else {
    compute_abs_sum_into(result,ext1,ext2);
    if ((result[4] & 8U) != 0) {
      return;
    }
    bVar1 = result[4] & 0xf6U | ext1[4] & 1U;
  }
  result[4] = bVar1;
  return;
}

Assistant:

void CVmObjBigNum::compute_diff_into(char *result,
                                     const char *ext1, const char *ext2)
{
    /* check to see if the numbers have the same sign */
    if (get_neg(ext1) == get_neg(ext2))
    {
        /* 
         *   The two numbers have the same sign, so the difference is the
         *   difference in the magnitudes, and has a sign depending on the
         *   order of the difference and the signs of the original values.
         *   If both values are positive, the difference is negative if the
         *   second value is larger than the first.  If both values are
         *   negative, the difference is negative if the second value has
         *   larger absolute value than the first.  
         */

        /* compute the difference in magnitudes */
        compute_abs_diff_into(result, ext1, ext2);

        /* 
         *   if the original values were negative, then the sign of the
         *   result is the opposite of the sign of the difference of the
         *   absolute values; otherwise, it's the same as the sign of the
         *   difference of the absolute values 
         */
        if (get_neg(ext1))
            negate(result);
    }
    else
    {
        /* 
         *   one is positive and the other is negative - the result has the
         *   sign of the first operand, and has magnitude equal to the sum of
         *   the absolute values 
         */

        /* compute the sum of the absolute values */
        compute_abs_sum_into(result, ext1, ext2);

        /* set the sign of the result to that of the first operand */
        if (!is_zero(result))
            set_neg(result, get_neg(ext1));
    }
}